

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

int nuraft::buffer::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = *(uint *)src;
  if ((int)uVar2 < 0) {
    uVar3 = uVar2 & 0x7fffffff;
  }
  else {
    uVar3 = (uint)*(ushort *)src;
  }
  if ((int)uVar2 < 0) {
    uVar2 = *(uint *)(src + 4);
  }
  else {
    uVar2 = (uint)*(ushort *)(src + 2);
  }
  alloc((buffer *)dst,(ulong)uVar3 - (ulong)uVar2);
  put(*(buffer **)dst,(buffer *)src);
  piVar1 = *(int **)dst;
  if (*piVar1 < 0) {
    piVar1[1] = 0;
  }
  else {
    *(undefined2 *)((long)piVar1 + 2) = 0;
  }
  return (int)dst;
}

Assistant:

ptr<buffer> buffer::copy(const buffer& buf) {
    ptr<buffer> other = alloc(buf.size() - buf.pos());
    other->put(buf);
    other->pos(0);
    return other;
}